

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# notch.hpp
# Opt level: O3

void __thiscall
notch::core::FullyConnectedLayer::calcInducedLocalField(FullyConnectedLayer *this,Array *inputs)

{
  element_type *peVar1;
  float *b_begin;
  float *m_begin;
  float *x_begin;
  float *pfVar2;
  float *x_end;
  size_t sVar3;
  float *b_end;
  size_t sVar4;
  
  peVar1 = (this->bias).super___shared_ptr<std::valarray<float>,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  sVar4 = (this->inducedLocalField)._M_size;
  sVar3 = peVar1->_M_size;
  if (sVar4 == sVar3) {
    if (sVar4 == 0) {
      sVar4 = 0;
    }
    else {
      memcpy((this->inducedLocalField)._M_data,peVar1->_M_data,sVar4 << 2);
      sVar4 = (this->inducedLocalField)._M_size;
    }
  }
  else {
    pfVar2 = (this->inducedLocalField)._M_data;
    if (pfVar2 != (float *)0x0) {
      operator_delete(pfVar2);
      sVar3 = peVar1->_M_size;
    }
    (this->inducedLocalField)._M_size = sVar3;
    pfVar2 = (float *)operator_new(sVar3 << 2);
    (this->inducedLocalField)._M_data = pfVar2;
    sVar4 = (this->inducedLocalField)._M_size;
    if (peVar1->_M_data != (float *)0x0) {
      memcpy(pfVar2,peVar1->_M_data,sVar4 * 4);
    }
  }
  peVar1 = (this->weights).super___shared_ptr<std::valarray<float>,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  b_begin = (this->inducedLocalField)._M_data;
  sVar3 = peVar1->_M_size;
  m_begin = peVar1->_M_data;
  pfVar2 = m_begin + sVar3;
  if (sVar3 == 0) {
    pfVar2 = (float *)0x0;
    m_begin = (float *)0x0;
  }
  x_begin = inputs->_M_data;
  x_end = x_begin + inputs->_M_size;
  if (inputs->_M_size == 0) {
    x_end = (float *)0x0;
    x_begin = (float *)0x0;
  }
  b_end = b_begin + sVar4;
  if (sVar4 == 0) {
    b_end = (float *)0x0;
    b_begin = (float *)0x0;
  }
  internal::gemv<float*,float_const*,float*>(m_begin,pfVar2,x_begin,x_end,b_begin,b_end);
  return;
}

Assistant:

void calcInducedLocalField(const Array &inputs) {
        inducedLocalField = *bias; // will be added and overwritten
        internal::gemv(
             std::begin(*weights), std::end(*weights), std::begin(inputs),
             std::end(inputs), std::begin(inducedLocalField),
             std::end(inducedLocalField));
    }